

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinuxReporters.cpp
# Opt level: O0

void __thiscall ApprovalTests::Linux::MeldReporter::MeldReporter(MeldReporter *this)

{
  DiffInfo *in_RDI;
  DiffInfo *in_stack_ffffffffffffffd8;
  GenericDiffReporter *in_stack_ffffffffffffffe0;
  
  DiffPrograms::Linux::MELD();
  GenericDiffReporter::GenericDiffReporter(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  DiffInfo::~DiffInfo(in_RDI);
  *(undefined ***)&in_RDI->program = &PTR__MeldReporter_0027bb28;
  return;
}

Assistant:

MeldReporter::MeldReporter() : GenericDiffReporter(DiffPrograms::Linux::MELD())
        {
        }